

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

bool __thiscall
iDynTree::InverseKinematics::getPoseForFrame
          (InverseKinematics *this,string *frameName,MatrixView<double> *transform)

{
  index_type iVar1;
  MatrixView<double> *in_RDX;
  bool bVar2;
  bool ok;
  int expected_transform_rows;
  int expected_transform_cols;
  bool local_1;
  
  iVar1 = MatrixView<double>::rows(in_RDX);
  bVar2 = false;
  if (iVar1 == 4) {
    iVar1 = MatrixView<double>::cols(in_RDX);
    bVar2 = iVar1 == 4;
  }
  if (bVar2) {
    local_1 = missingIpoptErrorReport();
  }
  else {
    iDynTree::reportError
              ("InverseKinematics","getPoseForFrame","Invalid size of the transform matrix");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool InverseKinematics::getPoseForFrame(const std::string& frameName,
                                            iDynTree::MatrixView<double> transform)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        const bool ok = (transform.rows() == expected_transform_rows)
            && (transform.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "getPoseForFrame",
                        "Invalid size of the transform matrix");
            return false;
        }

#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        toEigen(transform) = toEigen(IK_PIMPL(m_pimpl)->dynamics().getWorldTransform(frameName).asHomogeneousTransform());
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }